

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double incircleslow(double *pa,double *pb,double *pc,double *pd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double b;
  double b_00;
  double b_01;
  double b_02;
  double b_03;
  double b_04;
  double b_05;
  double b_06;
  double b_07;
  double b_08;
  double b_09;
  double b_10;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double _2;
  double _1;
  double _0;
  double _n;
  double _m;
  double _l;
  double _k;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double a1lo;
  double a1hi;
  double a0lo;
  double a0hi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  int i;
  int deterlen;
  int ablen;
  int clen;
  int blen;
  int alen;
  double deter [1152];
  double abdet [768];
  double cdet [384];
  double bdet [384];
  double adet [384];
  int y2len;
  int y1len;
  double y2 [192];
  double y1 [128];
  int ytytlen;
  int yytlen;
  int ytlen;
  int yylen;
  int ylen;
  double detytyt [64];
  double detyyt [64];
  double detyt [32];
  double detyy [64];
  double dety [32];
  int x2len;
  int x1len;
  double x2 [192];
  double x1 [128];
  int xtxtlen;
  int xxtlen;
  int xtlen;
  int xxlen;
  int xlen;
  double detxtxt [64];
  double detxxt [64];
  double detxt [32];
  double detxx [64];
  double detx [32];
  int temp16len;
  double temp16 [16];
  double cxay [8];
  double cxby [8];
  double bxay [8];
  double axcy [8];
  double bxcy [8];
  double axby [8];
  double cxay7;
  double cxby7;
  double bxay7;
  double axcy7;
  double bxcy7;
  double axby7;
  double negatetail;
  double negate;
  double cdytail;
  double bdytail;
  double adytail;
  double cdxtail;
  double bdxtail;
  double adxtail;
  double cdy;
  double bdy;
  double ady;
  double cdx;
  double bdx;
  double adx;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  b = *pa - *pd;
  b_00 = (*pa - (b + (*pa - b))) + ((*pa - b) - *pd);
  b_01 = pa[1] - pd[1];
  b_02 = (pa[1] - (b_01 + (pa[1] - b_01))) + ((pa[1] - b_01) - pd[1]);
  b_03 = *pb - *pd;
  b_04 = (*pb - (b_03 + (*pb - b_03))) + ((*pb - b_03) - *pd);
  b_05 = pb[1] - pd[1];
  b_06 = (pb[1] - (b_05 + (pb[1] - b_05))) + ((pb[1] - b_05) - pd[1]);
  b_07 = *pc - *pd;
  b_08 = (*pc - (b_07 + (*pc - b_07))) + ((*pc - b_07) - *pd);
  b_09 = pc[1] - pd[1];
  b_10 = (pc[1] - (b_09 + (pc[1] - b_09))) + ((pc[1] - b_09) - pd[1]);
  dVar7 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar8 = splitter * b_06 - (splitter * b_06 - b_06);
  bxcy[7] = (b_00 - dVar7) * (b_06 - dVar8) +
            -(-dVar7 * (b_06 - dVar8) + -(b_00 - dVar7) * dVar8 + -dVar7 * dVar8 + b_00 * b_06);
  dVar7 = -b_01;
  dVar8 = -b_02;
  dVar9 = splitter * b_04 - (splitter * b_04 - b_04);
  dVar10 = b_04 - dVar9;
  dVar11 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar12 = dVar8 - dVar11;
  dVar13 = b_04 * dVar8;
  cxby[7] = dVar10 * dVar12 + -(-dVar9 * dVar12 + -dVar10 * dVar11 + -dVar9 * dVar11 + dVar13);
  dVar14 = splitter * b_03 - (splitter * b_03 - b_03);
  dVar15 = b_03 - dVar14;
  dVar8 = b_03 * dVar8;
  dVar11 = dVar15 * dVar12 + -(-dVar14 * dVar12 + -dVar15 * dVar11 + -dVar14 * dVar11 + dVar8);
  dVar16 = dVar13 + dVar11;
  dVar11 = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar11 - (dVar16 - dVar13));
  dVar12 = dVar8 + dVar16;
  dVar16 = dVar16 - (dVar12 - dVar8);
  dVar8 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar13 = dVar7 - dVar8;
  dVar17 = b_04 * dVar7;
  dVar9 = dVar10 * dVar13 + -(-dVar9 * dVar13 + -dVar10 * dVar8 + -dVar9 * dVar8 + dVar17);
  dVar10 = dVar11 + dVar9;
  bxay[0] = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar9 - (dVar10 - dVar11));
  dVar9 = dVar16 + dVar10;
  dVar10 = (dVar16 - (dVar9 - (dVar9 - dVar16))) + (dVar10 - (dVar9 - dVar16));
  dVar11 = dVar12 + dVar9;
  dVar9 = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar9 - (dVar11 - dVar12));
  dVar7 = b_03 * dVar7;
  dVar8 = dVar15 * dVar13 + -(-dVar14 * dVar13 + -dVar15 * dVar8 + -dVar14 * dVar8 + dVar7);
  dVar12 = dVar17 + dVar8;
  dVar8 = (dVar17 - (dVar12 - (dVar12 - dVar17))) + (dVar8 - (dVar12 - dVar17));
  dVar13 = dVar10 + dVar8;
  bxay[1] = (dVar10 - (dVar13 - (dVar13 - dVar10))) + (dVar8 - (dVar13 - dVar10));
  dVar8 = dVar9 + dVar13;
  dVar9 = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (dVar13 - (dVar8 - dVar9));
  dVar10 = dVar11 + dVar8;
  dVar8 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar8 - (dVar10 - dVar11));
  dVar11 = dVar7 + dVar12;
  dVar7 = (dVar7 - (dVar11 - (dVar11 - dVar7))) + (dVar12 - (dVar11 - dVar7));
  dVar12 = dVar9 + dVar7;
  bxay[2] = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar7 - (dVar12 - dVar9));
  dVar7 = dVar8 + dVar12;
  dVar8 = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar12 - (dVar7 - dVar8));
  dVar9 = dVar10 + dVar7;
  dVar7 = (dVar10 - (dVar9 - (dVar9 - dVar10))) + (dVar7 - (dVar9 - dVar10));
  dVar10 = dVar8 + dVar11;
  bxay[3] = (dVar8 - (dVar10 - (dVar10 - dVar8))) + (dVar11 - (dVar10 - dVar8));
  dVar8 = dVar7 + dVar10;
  bxay[4] = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar10 - (dVar8 - dVar7));
  bxay[6] = dVar9 + dVar8;
  bxay[5] = (dVar9 - (bxay[6] - (bxay[6] - dVar9))) + (dVar8 - (bxay[6] - dVar9));
  dVar7 = splitter * b_04 - (splitter * b_04 - b_04);
  dVar8 = b_04 - dVar7;
  dVar9 = splitter * b_10 - (splitter * b_10 - b_10);
  dVar10 = b_10 - dVar9;
  dVar11 = b_04 * b_10;
  axcy[7] = dVar8 * dVar10 + -(-dVar7 * dVar10 + -dVar8 * dVar9 + -dVar7 * dVar9 + dVar11);
  dVar12 = splitter * b_03 - (splitter * b_03 - b_03);
  dVar13 = b_03 - dVar12;
  dVar14 = b_03 * b_10;
  dVar9 = dVar13 * dVar10 + -(-dVar12 * dVar10 + -dVar13 * dVar9 + -dVar12 * dVar9 + dVar14);
  dVar15 = dVar11 + dVar9;
  dVar9 = (dVar11 - (dVar15 - (dVar15 - dVar11))) + (dVar9 - (dVar15 - dVar11));
  dVar10 = dVar14 + dVar15;
  dVar15 = dVar15 - (dVar10 - dVar14);
  dVar11 = splitter * b_09 - (splitter * b_09 - b_09);
  dVar14 = b_09 - dVar11;
  dVar16 = b_04 * b_09;
  dVar7 = dVar8 * dVar14 + -(-dVar7 * dVar14 + -dVar8 * dVar11 + -dVar7 * dVar11 + dVar16);
  dVar8 = dVar9 + dVar7;
  bxcy[0] = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (dVar7 - (dVar8 - dVar9));
  dVar7 = dVar15 + dVar8;
  dVar8 = (dVar15 - (dVar7 - (dVar7 - dVar15))) + (dVar8 - (dVar7 - dVar15));
  dVar9 = dVar10 + dVar7;
  dVar7 = (dVar10 - (dVar9 - (dVar9 - dVar10))) + (dVar7 - (dVar9 - dVar10));
  dVar10 = b_03 * b_09;
  dVar11 = dVar13 * dVar14 + -(-dVar12 * dVar14 + -dVar13 * dVar11 + -dVar12 * dVar11 + dVar10);
  dVar12 = dVar16 + dVar11;
  dVar11 = (dVar16 - (dVar12 - (dVar12 - dVar16))) + (dVar11 - (dVar12 - dVar16));
  dVar13 = dVar8 + dVar11;
  bxcy[1] = (dVar8 - (dVar13 - (dVar13 - dVar8))) + (dVar11 - (dVar13 - dVar8));
  dVar8 = dVar7 + dVar13;
  dVar7 = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar13 - (dVar8 - dVar7));
  dVar11 = dVar9 + dVar8;
  dVar8 = (dVar9 - (dVar11 - (dVar11 - dVar9))) + (dVar8 - (dVar11 - dVar9));
  dVar9 = dVar10 + dVar12;
  dVar10 = (dVar10 - (dVar9 - (dVar9 - dVar10))) + (dVar12 - (dVar9 - dVar10));
  dVar12 = dVar7 + dVar10;
  bxcy[2] = (dVar7 - (dVar12 - (dVar12 - dVar7))) + (dVar10 - (dVar12 - dVar7));
  dVar7 = dVar8 + dVar12;
  dVar8 = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar12 - (dVar7 - dVar8));
  dVar10 = dVar11 + dVar7;
  dVar7 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar7 - (dVar10 - dVar11));
  dVar11 = dVar8 + dVar9;
  bxcy[3] = (dVar8 - (dVar11 - (dVar11 - dVar8))) + (dVar9 - (dVar11 - dVar8));
  dVar8 = dVar7 + dVar11;
  bxcy[4] = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar11 - (dVar8 - dVar7));
  bxcy[6] = dVar10 + dVar8;
  bxcy[5] = (dVar10 - (bxcy[6] - (bxcy[6] - dVar10))) + (dVar8 - (bxcy[6] - dVar10));
  dVar7 = -b_05;
  dVar8 = -b_06;
  dVar9 = splitter * b_08 - (splitter * b_08 - b_08);
  dVar10 = b_08 - dVar9;
  dVar11 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar12 = dVar8 - dVar11;
  dVar13 = b_08 * dVar8;
  cxay[7] = dVar10 * dVar12 + -(-dVar9 * dVar12 + -dVar10 * dVar11 + -dVar9 * dVar11 + dVar13);
  dVar14 = splitter * b_07 - (splitter * b_07 - b_07);
  dVar15 = b_07 - dVar14;
  dVar8 = b_07 * dVar8;
  dVar11 = dVar15 * dVar12 + -(-dVar14 * dVar12 + -dVar15 * dVar11 + -dVar14 * dVar11 + dVar8);
  dVar16 = dVar13 + dVar11;
  dVar11 = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar11 - (dVar16 - dVar13));
  dVar12 = dVar8 + dVar16;
  dVar16 = dVar16 - (dVar12 - dVar8);
  dVar8 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar13 = dVar7 - dVar8;
  dVar17 = b_08 * dVar7;
  dVar9 = dVar10 * dVar13 + -(-dVar9 * dVar13 + -dVar10 * dVar8 + -dVar9 * dVar8 + dVar17);
  dVar10 = dVar11 + dVar9;
  cxby[0] = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar9 - (dVar10 - dVar11));
  dVar9 = dVar16 + dVar10;
  dVar10 = (dVar16 - (dVar9 - (dVar9 - dVar16))) + (dVar10 - (dVar9 - dVar16));
  dVar11 = dVar12 + dVar9;
  dVar9 = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar9 - (dVar11 - dVar12));
  dVar7 = b_07 * dVar7;
  dVar8 = dVar15 * dVar13 + -(-dVar14 * dVar13 + -dVar15 * dVar8 + -dVar14 * dVar8 + dVar7);
  dVar12 = dVar17 + dVar8;
  dVar8 = (dVar17 - (dVar12 - (dVar12 - dVar17))) + (dVar8 - (dVar12 - dVar17));
  dVar13 = dVar10 + dVar8;
  cxby[1] = (dVar10 - (dVar13 - (dVar13 - dVar10))) + (dVar8 - (dVar13 - dVar10));
  dVar8 = dVar9 + dVar13;
  dVar9 = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (dVar13 - (dVar8 - dVar9));
  dVar10 = dVar11 + dVar8;
  dVar8 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar8 - (dVar10 - dVar11));
  dVar11 = dVar7 + dVar12;
  dVar7 = (dVar7 - (dVar11 - (dVar11 - dVar7))) + (dVar12 - (dVar11 - dVar7));
  dVar12 = dVar9 + dVar7;
  cxby[2] = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar7 - (dVar12 - dVar9));
  dVar7 = dVar8 + dVar12;
  dVar8 = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar12 - (dVar7 - dVar8));
  dVar9 = dVar10 + dVar7;
  dVar7 = (dVar10 - (dVar9 - (dVar9 - dVar10))) + (dVar7 - (dVar9 - dVar10));
  dVar10 = dVar8 + dVar11;
  cxby[3] = (dVar8 - (dVar10 - (dVar10 - dVar8))) + (dVar11 - (dVar10 - dVar8));
  dVar8 = dVar7 + dVar10;
  cxby[4] = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar10 - (dVar8 - dVar7));
  cxby[6] = dVar9 + dVar8;
  cxby[5] = (dVar9 - (cxby[6] - (cxby[6] - dVar9))) + (dVar8 - (cxby[6] - dVar9));
  dVar7 = splitter * b_08 - (splitter * b_08 - b_08);
  dVar8 = b_08 - dVar7;
  dVar9 = splitter * b_02 - (splitter * b_02 - b_02);
  dVar10 = b_02 - dVar9;
  dVar11 = b_08 * b_02;
  temp16[0xf] = dVar8 * dVar10 + -(-dVar7 * dVar10 + -dVar8 * dVar9 + -dVar7 * dVar9 + dVar11);
  dVar12 = splitter * b_07 - (splitter * b_07 - b_07);
  dVar13 = b_07 - dVar12;
  dVar14 = b_07 * b_02;
  dVar9 = dVar13 * dVar10 + -(-dVar12 * dVar10 + -dVar13 * dVar9 + -dVar12 * dVar9 + dVar14);
  dVar15 = dVar11 + dVar9;
  dVar9 = (dVar11 - (dVar15 - (dVar15 - dVar11))) + (dVar9 - (dVar15 - dVar11));
  dVar10 = dVar14 + dVar15;
  dVar15 = dVar15 - (dVar10 - dVar14);
  dVar11 = splitter * b_01 - (splitter * b_01 - b_01);
  dVar14 = b_01 - dVar11;
  dVar16 = b_08 * b_01;
  dVar7 = dVar8 * dVar14 + -(-dVar7 * dVar14 + -dVar8 * dVar11 + -dVar7 * dVar11 + dVar16);
  dVar8 = dVar9 + dVar7;
  cxay[0] = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (dVar7 - (dVar8 - dVar9));
  dVar7 = dVar15 + dVar8;
  dVar8 = (dVar15 - (dVar7 - (dVar7 - dVar15))) + (dVar8 - (dVar7 - dVar15));
  dVar9 = dVar10 + dVar7;
  dVar7 = (dVar10 - (dVar9 - (dVar9 - dVar10))) + (dVar7 - (dVar9 - dVar10));
  dVar10 = b_07 * b_01;
  dVar11 = dVar13 * dVar14 + -(-dVar12 * dVar14 + -dVar13 * dVar11 + -dVar12 * dVar11 + dVar10);
  dVar12 = dVar16 + dVar11;
  dVar11 = (dVar16 - (dVar12 - (dVar12 - dVar16))) + (dVar11 - (dVar12 - dVar16));
  dVar13 = dVar8 + dVar11;
  cxay[1] = (dVar8 - (dVar13 - (dVar13 - dVar8))) + (dVar11 - (dVar13 - dVar8));
  dVar8 = dVar7 + dVar13;
  dVar7 = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar13 - (dVar8 - dVar7));
  dVar11 = dVar9 + dVar8;
  dVar8 = (dVar9 - (dVar11 - (dVar11 - dVar9))) + (dVar8 - (dVar11 - dVar9));
  dVar9 = dVar10 + dVar12;
  dVar10 = (dVar10 - (dVar9 - (dVar9 - dVar10))) + (dVar12 - (dVar9 - dVar10));
  dVar12 = dVar7 + dVar10;
  cxay[2] = (dVar7 - (dVar12 - (dVar12 - dVar7))) + (dVar10 - (dVar12 - dVar7));
  dVar7 = dVar8 + dVar12;
  dVar8 = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar12 - (dVar7 - dVar8));
  dVar10 = dVar11 + dVar7;
  dVar7 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar7 - (dVar10 - dVar11));
  dVar11 = dVar8 + dVar9;
  cxay[3] = (dVar8 - (dVar11 - (dVar11 - dVar8))) + (dVar9 - (dVar11 - dVar8));
  dVar8 = dVar7 + dVar11;
  cxay[4] = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar11 - (dVar8 - dVar7));
  cxay[6] = dVar10 + dVar8;
  cxay[5] = (dVar10 - (cxay[6] - (cxay[6] - dVar10))) + (dVar8 - (cxay[6] - dVar10));
  dVar7 = -b_09;
  dVar8 = -b_10;
  dVar9 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar10 = b_00 - dVar9;
  dVar11 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar12 = dVar8 - dVar11;
  dVar13 = b_00 * dVar8;
  bxay[7] = dVar10 * dVar12 + -(-dVar9 * dVar12 + -dVar10 * dVar11 + -dVar9 * dVar11 + dVar13);
  dVar14 = splitter * b - (splitter * b - b);
  dVar15 = b - dVar14;
  dVar8 = b * dVar8;
  dVar11 = dVar15 * dVar12 + -(-dVar14 * dVar12 + -dVar15 * dVar11 + -dVar14 * dVar11 + dVar8);
  dVar16 = dVar13 + dVar11;
  dVar11 = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar11 - (dVar16 - dVar13));
  dVar12 = dVar8 + dVar16;
  dVar16 = dVar16 - (dVar12 - dVar8);
  dVar8 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar13 = dVar7 - dVar8;
  dVar17 = b_00 * dVar7;
  dVar9 = dVar10 * dVar13 + -(-dVar9 * dVar13 + -dVar10 * dVar8 + -dVar9 * dVar8 + dVar17);
  dVar10 = dVar11 + dVar9;
  axcy[0] = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar9 - (dVar10 - dVar11));
  dVar9 = dVar16 + dVar10;
  dVar10 = (dVar16 - (dVar9 - (dVar9 - dVar16))) + (dVar10 - (dVar9 - dVar16));
  dVar11 = dVar12 + dVar9;
  dVar9 = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar9 - (dVar11 - dVar12));
  dVar7 = b * dVar7;
  dVar8 = dVar15 * dVar13 + -(-dVar14 * dVar13 + -dVar15 * dVar8 + -dVar14 * dVar8 + dVar7);
  dVar12 = dVar17 + dVar8;
  dVar8 = (dVar17 - (dVar12 - (dVar12 - dVar17))) + (dVar8 - (dVar12 - dVar17));
  dVar13 = dVar10 + dVar8;
  axcy[1] = (dVar10 - (dVar13 - (dVar13 - dVar10))) + (dVar8 - (dVar13 - dVar10));
  dVar8 = dVar9 + dVar13;
  dVar9 = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (dVar13 - (dVar8 - dVar9));
  dVar10 = dVar11 + dVar8;
  dVar8 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar8 - (dVar10 - dVar11));
  dVar11 = dVar7 + dVar12;
  dVar7 = (dVar7 - (dVar11 - (dVar11 - dVar7))) + (dVar12 - (dVar11 - dVar7));
  dVar12 = dVar9 + dVar7;
  axcy[2] = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar7 - (dVar12 - dVar9));
  dVar7 = dVar8 + dVar12;
  dVar8 = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar12 - (dVar7 - dVar8));
  dVar9 = dVar10 + dVar7;
  dVar7 = (dVar10 - (dVar9 - (dVar9 - dVar10))) + (dVar7 - (dVar9 - dVar10));
  dVar10 = dVar8 + dVar11;
  axcy[3] = (dVar8 - (dVar10 - (dVar10 - dVar8))) + (dVar11 - (dVar10 - dVar8));
  dVar8 = dVar7 + dVar10;
  axcy[4] = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar10 - (dVar8 - dVar7));
  axcy[6] = dVar9 + dVar8;
  axcy[5] = (dVar9 - (axcy[6] - (axcy[6] - dVar9))) + (dVar8 - (axcy[6] - dVar9));
  iVar1 = fast_expansion_sum_zeroelim(8,axcy + 7,8,cxay + 7,(double *)&stack0xfffffffffffffd38);
  iVar2 = scale_expansion_zeroelim(iVar1,(double *)&stack0xfffffffffffffd38,b,detxx + 0x3f);
  iVar2 = scale_expansion_zeroelim(iVar2,detxx + 0x3f,b,detxt + 0x1f);
  iVar3 = scale_expansion_zeroelim(iVar1,(double *)&stack0xfffffffffffffd38,b_00,detxxt + 0x3f);
  iVar4 = scale_expansion_zeroelim(iVar3,detxxt + 0x3f,b,detxtxt + 0x3f);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar4; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detxtxt[(long)bvirt._0_4_ + 0x3f] = detxtxt[(long)bvirt._0_4_ + 0x3f] * 2.0;
  }
  iVar3 = scale_expansion_zeroelim(iVar3,detxxt + 0x3f,b_00,(double *)&xxlen);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,detxt + 0x1f,iVar4,detxtxt + 0x3f,x2 + 0xbf);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,x2 + 0xbf,iVar3,(double *)&xxlen,(double *)&x2len);
  iVar3 = scale_expansion_zeroelim(iVar1,(double *)&stack0xfffffffffffffd38,b_01,detyy + 0x3f);
  iVar3 = scale_expansion_zeroelim(iVar3,detyy + 0x3f,b_01,detyt + 0x1f);
  iVar1 = scale_expansion_zeroelim(iVar1,(double *)&stack0xfffffffffffffd38,b_02,detyyt + 0x3f);
  iVar4 = scale_expansion_zeroelim(iVar1,detyyt + 0x3f,b_01,detytyt + 0x3f);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar4; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detytyt[(long)bvirt._0_4_ + 0x3f] = detytyt[(long)bvirt._0_4_ + 0x3f] * 2.0;
  }
  iVar1 = scale_expansion_zeroelim(iVar1,detyyt + 0x3f,b_02,(double *)&yylen);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,detyt + 0x1f,iVar4,detytyt + 0x3f,y2 + 0xbf);
  iVar1 = fast_expansion_sum_zeroelim(iVar3,y2 + 0xbf,iVar1,(double *)&yylen,(double *)&y2len);
  iVar1 = fast_expansion_sum_zeroelim(iVar2,(double *)&x2len,iVar1,(double *)&y2len,bdet + 0x17f);
  iVar2 = fast_expansion_sum_zeroelim(8,temp16 + 0xf,8,bxay + 7,(double *)&stack0xfffffffffffffd38);
  iVar3 = scale_expansion_zeroelim(iVar2,(double *)&stack0xfffffffffffffd38,b_03,detxx + 0x3f);
  iVar3 = scale_expansion_zeroelim(iVar3,detxx + 0x3f,b_03,detxt + 0x1f);
  iVar4 = scale_expansion_zeroelim(iVar2,(double *)&stack0xfffffffffffffd38,b_04,detxxt + 0x3f);
  iVar5 = scale_expansion_zeroelim(iVar4,detxxt + 0x3f,b_03,detxtxt + 0x3f);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar5; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detxtxt[(long)bvirt._0_4_ + 0x3f] = detxtxt[(long)bvirt._0_4_ + 0x3f] * 2.0;
  }
  iVar4 = scale_expansion_zeroelim(iVar4,detxxt + 0x3f,b_04,(double *)&xxlen);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,detxt + 0x1f,iVar5,detxtxt + 0x3f,x2 + 0xbf);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,x2 + 0xbf,iVar4,(double *)&xxlen,(double *)&x2len);
  iVar4 = scale_expansion_zeroelim(iVar2,(double *)&stack0xfffffffffffffd38,b_05,detyy + 0x3f);
  iVar4 = scale_expansion_zeroelim(iVar4,detyy + 0x3f,b_05,detyt + 0x1f);
  iVar2 = scale_expansion_zeroelim(iVar2,(double *)&stack0xfffffffffffffd38,b_06,detyyt + 0x3f);
  iVar5 = scale_expansion_zeroelim(iVar2,detyyt + 0x3f,b_05,detytyt + 0x3f);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar5; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detytyt[(long)bvirt._0_4_ + 0x3f] = detytyt[(long)bvirt._0_4_ + 0x3f] * 2.0;
  }
  iVar2 = scale_expansion_zeroelim(iVar2,detyyt + 0x3f,b_06,(double *)&yylen);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,detyt + 0x1f,iVar5,detytyt + 0x3f,y2 + 0xbf);
  iVar2 = fast_expansion_sum_zeroelim(iVar4,y2 + 0xbf,iVar2,(double *)&yylen,(double *)&y2len);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,(double *)&x2len,iVar2,(double *)&y2len,cdet + 0x17f);
  iVar3 = fast_expansion_sum_zeroelim(8,bxcy + 7,8,cxby + 7,(double *)&stack0xfffffffffffffd38);
  iVar4 = scale_expansion_zeroelim(iVar3,(double *)&stack0xfffffffffffffd38,b_07,detxx + 0x3f);
  iVar4 = scale_expansion_zeroelim(iVar4,detxx + 0x3f,b_07,detxt + 0x1f);
  iVar5 = scale_expansion_zeroelim(iVar3,(double *)&stack0xfffffffffffffd38,b_08,detxxt + 0x3f);
  iVar6 = scale_expansion_zeroelim(iVar5,detxxt + 0x3f,b_07,detxtxt + 0x3f);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar6; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detxtxt[(long)bvirt._0_4_ + 0x3f] = detxtxt[(long)bvirt._0_4_ + 0x3f] * 2.0;
  }
  iVar5 = scale_expansion_zeroelim(iVar5,detxxt + 0x3f,b_08,(double *)&xxlen);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,detxt + 0x1f,iVar6,detxtxt + 0x3f,x2 + 0xbf);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,x2 + 0xbf,iVar5,(double *)&xxlen,(double *)&x2len);
  iVar5 = scale_expansion_zeroelim(iVar3,(double *)&stack0xfffffffffffffd38,b_09,detyy + 0x3f);
  iVar5 = scale_expansion_zeroelim(iVar5,detyy + 0x3f,b_09,detyt + 0x1f);
  iVar3 = scale_expansion_zeroelim(iVar3,(double *)&stack0xfffffffffffffd38,b_10,detyyt + 0x3f);
  iVar6 = scale_expansion_zeroelim(iVar3,detyyt + 0x3f,b_09,detytyt + 0x3f);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar6; bvirt._0_4_ = bvirt._0_4_ + 1) {
    detytyt[(long)bvirt._0_4_ + 0x3f] = detytyt[(long)bvirt._0_4_ + 0x3f] * 2.0;
  }
  iVar3 = scale_expansion_zeroelim(iVar3,detyyt + 0x3f,b_10,(double *)&yylen);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,detyt + 0x1f,iVar6,detytyt + 0x3f,y2 + 0xbf);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,y2 + 0xbf,iVar3,(double *)&yylen,(double *)&y2len);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,(double *)&x2len,iVar3,(double *)&y2len,abdet + 0x2ff);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,bdet + 0x17f,iVar2,cdet + 0x17f,deter + 0x47f);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,deter + 0x47f,iVar3,abdet + 0x2ff,(double *)&blen);
  return *(double *)(&blen + (long)(iVar1 + -1) * 2);
}

Assistant:

REAL incircleslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL adx, bdx, cdx, ady, bdy, cdy;
  REAL adxtail, bdxtail, cdxtail;
  REAL adytail, bdytail, cdytail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16];
  int temp16len;
  REAL detx[32], detxx[64], detxt[32], detxxt[64], detxtxt[64];
  int xlen, xxlen, xtlen, xxtlen, xtxtlen;
  REAL x1[128], x2[192];
  int x1len, x2len;
  REAL dety[32], detyy[64], detyt[32], detyyt[64], detytyt[64];
  int ylen, yylen, ytlen, yytlen, ytytlen;
  REAL y1[128], y2[192];
  int y1len, y2len;
  REAL adet[384], bdet[384], cdet[384], abdet[768], deter[1152];
  int alen, blen, clen, ablen, deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;


  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, adx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, adx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, adxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, adx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, adxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, ady, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, ady, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, adytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, ady, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, adytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  alen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, adet);


  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, bdx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, bdx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, bdxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, bdx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, bdxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, bdy, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, bdy, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, bdytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, bdy, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, bdytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  blen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, bdet);


  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, cdx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, cdx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, cdxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, cdx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, cdxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, cdy, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, cdy, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, cdytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, cdy, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, cdytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  clen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}